

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O1

LCC_API_CLOUD_PROVIDER __thiscall
license::os::ExecutionEnvironment::cloud_provider(ExecutionEnvironment *this)

{
  pointer pcVar1;
  long lVar2;
  LCC_API_CLOUD_PROVIDER LVar3;
  string bios_description;
  string sys_vendor;
  string bios_vendor;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (this->m_dmi_info).m_bios_description._M_dataplus._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,
             pcVar1 + (this->m_dmi_info).m_bios_description._M_string_length);
  pcVar1 = (this->m_dmi_info).m_bios_vendor._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->m_dmi_info).m_bios_vendor._M_string_length);
  pcVar1 = (this->m_dmi_info).m_sys_vendor._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->m_dmi_info).m_sys_vendor._M_string_length);
  if (((local_78 != 0) || (local_38 != 0)) || (LVar3 = PROV_UNKNOWN, local_58 != 0)) {
    lVar2 = std::__cxx11::string::find((char *)&local_40,0x43cdb1,0);
    LVar3 = ALI_CLOUD;
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cdb9,0);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find((char *)&local_60,0x43cdb9,0);
        if (lVar2 == -1) {
          lVar2 = std::__cxx11::string::find((char *)&local_60,0x43cdc1,0);
          LVar3 = GOOGLE_CLOUD;
          if (lVar2 == -1) {
            lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cdc8,0);
            if (lVar2 == -1) {
              lVar2 = std::__cxx11::string::find((char *)&local_40,0x43cddc,0);
              LVar3 = AWS;
              if (lVar2 == -1) {
                lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cde0,0);
                if (lVar2 == -1) {
                  lVar2 = std::__cxx11::string::find((char *)&local_60,0x43cddc,0);
                  if (lVar2 == -1) {
                    lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cde7,0);
                    if (lVar2 == -1) {
                      LVar3 = PROV_UNKNOWN;
                      lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cdf1,0);
                      if (lVar2 == -1) {
                        lVar2 = std::__cxx11::string::find((char *)&local_80,0x43cdf6,0);
                        if (lVar2 == -1) goto LAB_0018af03;
                      }
                    }
                    LVar3 = ON_PREMISE;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0018af03:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return LVar3;
}

Assistant:

LCC_API_CLOUD_PROVIDER ExecutionEnvironment::cloud_provider() const {
	LCC_API_CLOUD_PROVIDER result = PROV_UNKNOWN;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if (bios_description.size() > 0 || bios_vendor.size() > 0 || sys_vendor.size() > 0) {
		if (bios_vendor.find("SEABIOS") != string::npos || bios_description.find("ALIBABA") != string::npos ||
			sys_vendor.find("ALIBABA") != string::npos) {
			result = ALI_CLOUD;
		} else if (sys_vendor.find("GOOGLE") != string::npos ||
				   bios_description.find("GOOGLECOMPUTEENGINE") != string::npos) {
			result = GOOGLE_CLOUD;
		} else if (bios_vendor.find("AWS") != string::npos || bios_description.find("AMAZON") != string::npos ||
				   sys_vendor.find("AWS") != string::npos) {
			result = AWS;
		} else if (bios_description.find("HP-COMPAQ") != string::npos ||
				   bios_description.find("ASUS") != string::npos || bios_description.find("DELL") != string::npos) {
			result = ON_PREMISE;
		}
	}
	return result;
}